

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::_setToDecNum
          (DecimalQuantity *this,DecNum *decnum,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  UErrorCode *status_local;
  DecNum *decnum_local;
  DecimalQuantity *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    bVar2 = DecNum::isNegative(decnum);
    if (bVar2) {
      this->flags = this->flags | ::(anonymous_namespace)::NEGATIVE_FLAG;
    }
    bVar2 = DecNum::isZero(decnum);
    if (!bVar2) {
      readDecNumberToBcd(this,decnum);
      compact(this);
    }
  }
  return;
}

Assistant:

void DecimalQuantity::_setToDecNum(const DecNum& decnum, UErrorCode& status) {
    if (U_FAILURE(status)) { return; }
    if (decnum.isNegative()) {
        flags |= NEGATIVE_FLAG;
    }
    if (!decnum.isZero()) {
        readDecNumberToBcd(decnum);
        compact();
    }
}